

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_proxy_stderr.c
# Opt level: O1

void log_proxy_stderr(Plug *plug,ProxyStderrBuf *psb,void *vdata,size_t len)

{
  void *pvVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (len != 0) {
    do {
      uVar7 = psb->size;
      if (0x1fff < uVar7) {
        __assert_fail("psb->size < lenof(psb->buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/log_proxy_stderr.c"
                      ,0x23,"void log_proxy_stderr(Plug *, ProxyStderrBuf *, const void *, size_t)")
        ;
      }
      uVar4 = 0x2000 - uVar7;
      if (len <= 0x2000 - uVar7) {
        uVar4 = len;
      }
      memcpy(psb->buf + uVar7,vdata,uVar4);
      vdata = (void *)((long)vdata + uVar4);
      len = len - uVar4;
      psb->size = psb->size + uVar4;
      uVar7 = 0;
      do {
        sVar3 = psb->size - uVar7;
        if (psb->size < uVar7 || sVar3 == 0) break;
        pvVar1 = memchr(psb->buf + uVar7,10,sVar3);
        if (pvVar1 != (void *)0x0) {
          uVar6 = (long)pvVar1 - (long)psb;
          uVar5 = uVar6;
          for (uVar4 = uVar6;
              (uVar7 < uVar4 &&
              ((psb->buf[uVar4 - 1] == '\r' || (uVar5 = uVar4, psb->buf[uVar4 - 1] == '\n'))));
              uVar4 = uVar4 - 1) {
            uVar5 = uVar7;
          }
          pcVar2 = dupprintf("proxy: %.*s",(ulong)(uint)((int)uVar5 - (int)uVar7),psb->buf + uVar7);
          (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar2,0);
          safefree(pcVar2);
          uVar7 = uVar6 + 1;
          if (psb->size < uVar7) {
            __assert_fail("pos <= psb->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/log_proxy_stderr.c"
                          ,0x42,
                          "void log_proxy_stderr(Plug *, ProxyStderrBuf *, const void *, size_t)");
          }
        }
      } while (pvVar1 != (void *)0x0);
      if (uVar7 == 0) {
        if (psb->size == 0x2000) {
          pcVar2 = dupprintf("proxy (partial line): %.*s",0x2000,psb);
          (*plug->vt->log)(plug,PLUGLOG_PROXY_MSG,(SockAddr *)0x0,0,pcVar2,0);
          safefree(pcVar2);
          psb->size = 0;
        }
        uVar7 = 0;
      }
      sVar3 = psb->size - uVar7;
      if (sVar3 != 0) {
        memmove(psb,psb->buf + uVar7,sVar3);
      }
      psb->size = sVar3;
    } while (len != 0);
  }
  return;
}

Assistant:

void log_proxy_stderr(Plug *plug, ProxyStderrBuf *psb,
                      const void *vdata, size_t len)
{
    const char *data = (const char *)vdata;

    /*
     * This helper function allows us to collect the data written to a
     * local proxy command's standard error in whatever size chunks we
     * happen to get from its pipe, and whenever we have a complete
     * line, we pass it to plug_log.
     *
     * (We also do this when the buffer in psb fills up, to avoid just
     * allocating more and more memory forever, and also to keep Event
     * Log lines reasonably bounded in size.)
     *
     * Prerequisites: a plug to log to, and a ProxyStderrBuf stored
     * somewhere to collect any not-yet-output partial line.
     */

    while (len > 0) {
        /*
         * Copy as much data into psb->buf as will fit.
         */
        assert(psb->size < lenof(psb->buf));
        size_t to_consume = lenof(psb->buf) - psb->size;
        if (to_consume > len)
            to_consume = len;
        memcpy(psb->buf + psb->size, data, to_consume);
        data += to_consume;
        len -= to_consume;
        psb->size += to_consume;

        /*
         * Output any full lines in psb->buf.
         */
        size_t pos = 0;
        while (pos < psb->size) {
            char *nlpos = memchr(psb->buf + pos, '\n', psb->size - pos);
            if (!nlpos)
                break;

            /*
             * Found a newline in the buffer, so we can output a line.
             */
            size_t endpos = nlpos - psb->buf;
            while (endpos > pos && (psb->buf[endpos-1] == '\n' ||
                                    psb->buf[endpos-1] == '\r'))
                endpos--;
            char *msg = dupprintf(
                "proxy: %.*s", (int)(endpos - pos), psb->buf + pos);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, msg, 0);
            sfree(msg);

            pos = nlpos - psb->buf + 1;
            assert(pos <= psb->size);
        }

        /*
         * If the buffer is completely full and we didn't output
         * anything, then output the whole thing, flagging it as a
         * truncated line.
         */
        if (pos == 0 && psb->size == lenof(psb->buf)) {
            char *msg = dupprintf(
                "proxy (partial line): %.*s", (int)psb->size, psb->buf);
            plug_log(plug, PLUGLOG_PROXY_MSG, NULL, 0, msg, 0);
            sfree(msg);

            pos = psb->size = 0;
        }

        /*
         * Now move any remaining data up to the front of the buffer.
         */
        size_t newsize = psb->size - pos;
        if (newsize)
            memmove(psb->buf, psb->buf + pos, newsize);
        psb->size = newsize;

        /*
         * And loop round again if there's more data to be read from
         * our input.
         */
    }
}